

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahost.c
# Opt level: O2

void ai_callback(void *arg,int status,int timeouts,ares_addrinfo *result)

{
  int iVar1;
  ares_addrinfo_node *paVar2;
  FILE *__stream;
  undefined8 uVar3;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  long lVar4;
  ares_addrinfo_node **ppaVar5;
  char addr_buf [64];
  
  __stream = _stderr;
  if (status == 0) {
    ppaVar5 = &result->nodes;
    while (paVar2 = *ppaVar5, paVar2 != (ares_addrinfo_node *)0x0) {
      addr_buf[0x30] = '\0';
      addr_buf[0x31] = '\0';
      addr_buf[0x32] = '\0';
      addr_buf[0x33] = '\0';
      addr_buf[0x34] = '\0';
      addr_buf[0x35] = '\0';
      addr_buf[0x36] = '\0';
      addr_buf[0x37] = '\0';
      addr_buf[0x38] = '\0';
      addr_buf[0x39] = '\0';
      addr_buf[0x3a] = '\0';
      addr_buf[0x3b] = '\0';
      addr_buf[0x3c] = '\0';
      addr_buf[0x3d] = '\0';
      addr_buf[0x3e] = '\0';
      addr_buf[0x3f] = '\0';
      addr_buf[0x20] = '\0';
      addr_buf[0x21] = '\0';
      addr_buf[0x22] = '\0';
      addr_buf[0x23] = '\0';
      addr_buf[0x24] = '\0';
      addr_buf[0x25] = '\0';
      addr_buf[0x26] = '\0';
      addr_buf[0x27] = '\0';
      addr_buf[0x28] = '\0';
      addr_buf[0x29] = '\0';
      addr_buf[0x2a] = '\0';
      addr_buf[0x2b] = '\0';
      addr_buf[0x2c] = '\0';
      addr_buf[0x2d] = '\0';
      addr_buf[0x2e] = '\0';
      addr_buf[0x2f] = '\0';
      addr_buf[0x10] = '\0';
      addr_buf[0x11] = '\0';
      addr_buf[0x12] = '\0';
      addr_buf[0x13] = '\0';
      addr_buf[0x14] = '\0';
      addr_buf[0x15] = '\0';
      addr_buf[0x16] = '\0';
      addr_buf[0x17] = '\0';
      addr_buf[0x18] = '\0';
      addr_buf[0x19] = '\0';
      addr_buf[0x1a] = '\0';
      addr_buf[0x1b] = '\0';
      addr_buf[0x1c] = '\0';
      addr_buf[0x1d] = '\0';
      addr_buf[0x1e] = '\0';
      addr_buf[0x1f] = '\0';
      addr_buf[0] = '\0';
      addr_buf[1] = '\0';
      addr_buf[2] = '\0';
      addr_buf[3] = '\0';
      addr_buf[4] = '\0';
      addr_buf[5] = '\0';
      addr_buf[6] = '\0';
      addr_buf[7] = '\0';
      addr_buf[8] = '\0';
      addr_buf[9] = '\0';
      addr_buf[10] = '\0';
      addr_buf[0xb] = '\0';
      addr_buf[0xc] = '\0';
      addr_buf[0xd] = '\0';
      addr_buf[0xe] = '\0';
      addr_buf[0xf] = '\0';
      iVar1 = paVar2->ai_family;
      lVar4 = 4;
      if (iVar1 == 2) {
LAB_0010188b:
        ares_inet_ntop(iVar1,paVar2->ai_addr->sa_data + lVar4 + -2,addr_buf,0x40);
        printf("%-32s\t%s\n",result->name,addr_buf);
      }
      else if (iVar1 == 10) {
        lVar4 = 8;
        goto LAB_0010188b;
      }
      ppaVar5 = &paVar2->ai_next;
    }
    ares_freeaddrinfo(result);
  }
  else {
    uVar3 = ares_strerror(status,CONCAT44(in_register_00000034,status),
                          CONCAT44(in_register_00000014,timeouts));
    fprintf(__stream,"%s: %s\n",arg,uVar3);
    final_rv = 1;
  }
  return;
}

Assistant:

static void ai_callback(void *arg, int status, int timeouts,
                        struct ares_addrinfo *result)
{
  struct ares_addrinfo_node *node = NULL;
  (void)timeouts;


  if (status != ARES_SUCCESS) {
    fprintf(stderr, "%s: %s\n", (char *)arg, ares_strerror(status));
    final_rv = RV_FAIL;
    return;
  }

  for (node = result->nodes; node != NULL; node = node->ai_next) {
    char        addr_buf[64] = "";
    const void *ptr          = NULL;
    if (node->ai_family == AF_INET) {
      const struct sockaddr_in *in_addr =
        (const struct sockaddr_in *)((void *)node->ai_addr);
      ptr = &in_addr->sin_addr;
    } else if (node->ai_family == AF_INET6) {
      const struct sockaddr_in6 *in_addr =
        (const struct sockaddr_in6 *)((void *)node->ai_addr);
      ptr = &in_addr->sin6_addr;
    } else {
      continue;
    }
    ares_inet_ntop(node->ai_family, ptr, addr_buf, sizeof(addr_buf));
    printf("%-32s\t%s\n", result->name, addr_buf);
  }

  ares_freeaddrinfo(result);
}